

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t unicode_to_utf16le(char *p,size_t remaining,uint32_t uc)

{
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  char *utf16;
  undefined8 local_8;
  
  if (in_EDX < 0x10000) {
    if (in_RSI < 2) {
      local_8 = 0;
    }
    else {
      archive_le16enc(in_RDI,(uint16_t)in_EDX);
      local_8 = 2;
    }
  }
  else if (in_RSI < 4) {
    local_8 = 0;
  }
  else {
    archive_le16enc(in_RDI,((ushort)(in_EDX - 0x10000 >> 10) & 0x3ff) + 0xd800);
    archive_le16enc((void *)((long)in_RDI + 2),((ushort)(in_EDX - 0x10000) & 0x3ff) + 0xdc00);
    local_8 = 4;
  }
  return local_8;
}

Assistant:

static size_t
unicode_to_utf16le(char *p, size_t remaining, uint32_t uc)
{
	char *utf16 = p;

	if (uc > 0xffff) {
		/* We have a code point that won't fit into a
		 * wchar_t; convert it to a surrogate pair. */
		if (remaining < 4)
			return (0);
		uc -= 0x10000;
		archive_le16enc(utf16, ((uc >> 10) & 0x3ff) + 0xD800);
		archive_le16enc(utf16+2, (uc & 0x3ff) + 0xDC00);
		return (4);
	} else {
		if (remaining < 2)
			return (0);
		archive_le16enc(utf16, uc);
		return (2);
	}
}